

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMU_SENSITIVE_COMPOSITE_Unmarshal
                 (TPMU_SENSITIVE_COMPOSITE *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  TPM_RC TVar1;
  
  if (selector == 0x25) {
    TVar1 = UINT16_Unmarshal((UINT16 *)target,buffer,size);
    if (TVar1 == 0) {
      TVar1 = 0x95;
      if (*(ushort *)target < 0x21) {
        TVar1 = BYTE_Array_Unmarshal((BYTE *)((long)target + 2),buffer,size,(uint)*(ushort *)target)
        ;
        return TVar1;
      }
    }
    return TVar1;
  }
  if (selector == 8) {
    TVar1 = UINT16_Unmarshal((UINT16 *)target,buffer,size);
    if (TVar1 == 0) {
      TVar1 = 0x95;
      if (*(ushort *)target < 0x85) {
        TVar1 = BYTE_Array_Unmarshal((BYTE *)((long)target + 2),buffer,size,(uint)*(ushort *)target)
        ;
        return TVar1;
      }
    }
    return TVar1;
  }
  if (selector == 0x23) {
    TVar1 = UINT16_Unmarshal((UINT16 *)target,buffer,size);
    if (TVar1 == 0) {
      TVar1 = 0x95;
      if (*(ushort *)target < 0x21) {
        TVar1 = BYTE_Array_Unmarshal((BYTE *)((long)target + 2),buffer,size,(uint)*(ushort *)target)
        ;
        return TVar1;
      }
    }
    return TVar1;
  }
  if (selector != 1) {
    return 0x98;
  }
  TVar1 = UINT16_Unmarshal((UINT16 *)target,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0x95;
    if (*(ushort *)target < 0x81) {
      TVar1 = BYTE_Array_Unmarshal((BYTE *)((long)target + 2),buffer,size,(uint)*(ushort *)target);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMU_SENSITIVE_COMPOSITE_Unmarshal(TPMU_SENSITIVE_COMPOSITE *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPM2B_PRIVATE_KEY_RSA_Unmarshal((TPM2B_PRIVATE_KEY_RSA *)&(target->rsa), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)&(target->ecc), buffer, size);
#endif // ALG_ECC
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPM2B_SENSITIVE_DATA_Unmarshal((TPM2B_SENSITIVE_DATA *)&(target->bits), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPM2B_SYM_KEY_Unmarshal((TPM2B_SYM_KEY *)&(target->sym), buffer, size);
#endif // ALG_SYMCIPHER
    }
    return TPM_RC_SELECTOR;
}